

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O2

void Super_WriteLibraryTreeStr_rec
               (Vec_Str_t *vStr,Super_Man_t *pMan,Super_Gate_t_conflict *pSuper,int *pCounter)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  if ((*(uint *)&pSuper->field_0x8 & 0xffffff01) != 0) {
    return;
  }
  uStack_50 = 0x354e4c;
  uVar2 = Mio_GateReadPinNum(pSuper->pRoot);
  uVar3 = 0;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar3;
  }
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    uStack_50 = 0x354e6f;
    Super_WriteLibraryTreeStr_rec(vStr,pMan,pSuper->pFanins[uVar3],pCounter);
  }
  iVar1 = *pCounter;
  *pCounter = iVar1 + 1;
  uVar2 = *(uint *)&pSuper->field_0x8;
  *(uint *)&pSuper->field_0x8 = iVar1 << 8 | uVar2 & 0xff;
  pcVar4 = "* ";
  if ((uVar2 & 2) == 0) {
    pcVar4 = "";
  }
  uStack_50 = 0x354eac;
  Vec_StrPrintStr(vStr,pcVar4);
  uStack_50 = 0x354eb4;
  pcVar4 = Mio_GateReadName(pSuper->pRoot);
  uStack_50 = 0x354ebf;
  Vec_StrPrintStr(vStr,pcVar4);
  uStack_50 = 10;
  for (uVar3 = 0; uVar3 != uVar6; uVar3 = uVar3 + 1) {
    uStack_50 = 0x354ed9;
    Vec_StrPrintStr(vStr," ");
    uVar2 = *(uint *)&pSuper->pFanins[uVar3]->field_0x8;
    if (uVar2 < 0x100) {
      uStack_50 = 0x354ef3;
      Vec_StrPush(vStr,'0');
    }
    else {
      lVar5 = 0;
      for (uVar2 = uVar2 >> 8; uVar2 != 0; uVar2 = uVar2 / 10) {
        local_48[lVar5] = (char)((ulong)uVar2 % 10);
        lVar5 = lVar5 + 1;
      }
      for (; 0 < lVar5; lVar5 = lVar5 + -1) {
        uStack_50 = 0x354f21;
        Vec_StrPush(vStr,local_48[lVar5 + -1] + '0');
      }
    }
  }
  Vec_StrPrintStr(vStr,"\n");
  return;
}

Assistant:

void Super_WriteLibraryTreeStr_rec( Vec_Str_t * vStr, Super_Man_t * pMan, Super_Gate_t * pSuper, int * pCounter )
{
    int nFanins, i;
    // skip an elementary variable and a gate that was already written
    if ( pSuper->fVar || pSuper->Number > 0 )
        return;
    // write the fanins
    nFanins = Mio_GateReadPinNum(pSuper->pRoot);
    for ( i = 0; i < nFanins; i++ )
        Super_WriteLibraryTreeStr_rec( vStr, pMan, pSuper->pFanins[i], pCounter );
    // finally write the gate
    pSuper->Number = (*pCounter)++;
//    fprintf( pFile, "%s", pSuper->fSuper? "* " : "" );
//    fprintf( pFile, "%s", Mio_GateReadName(pSuper->pRoot) );
//    for ( i = 0; i < nFanins; i++ )
//        fprintf( pFile, " %d", pSuper->pFanins[i]->Number );
    Vec_StrPrintStr( vStr, pSuper->fSuper? "* " : "" );
    Vec_StrPrintStr( vStr, Mio_GateReadName(pSuper->pRoot) );
    for ( i = 0; i < nFanins; i++ )
    {
        Vec_StrPrintStr( vStr, " " );
        Vec_StrPrintNum( vStr, pSuper->pFanins[i]->Number );    
    }
    // write the formula 
    // this step is optional, the resulting library will work in any case
    // however, it may be helpful to for debugging to compare the same library 
    // written in the old format and written in the new format with formulas
//    fprintf( pFile, "    # %s", Super_WriteLibraryGateName( pSuper ) );
//    fprintf( pFile, "\n" );
    Vec_StrPrintStr( vStr, "\n" );
}